

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int texWid,int texHei)

{
  int height_;
  int width_;
  char *vtxShaderSource_;
  char *fragShaderSource_;
  Vector<float,_4> local_1ed0;
  Vector<float,_4> local_1ec0;
  TextureSpec local_1eb0;
  int local_1e60;
  allocator<char> local_1e59;
  string local_1e58;
  VarSpec local_1e38;
  Matrix<float,_4,_4> local_1d8c;
  Matrix<float,_4,_4> local_1d4c;
  allocator<char> local_1d09;
  string local_1d08;
  VarSpec local_1ce8;
  Matrix<float,_3,_3> local_1c3c;
  Matrix<float,_3,_3> local_1c18;
  allocator<char> local_1bf1;
  string local_1bf0;
  VarSpec local_1bd0;
  Matrix<float,_4,_4> local_1b24;
  Matrix<float,_4,_4> local_1ae4;
  allocator<char> local_1aa1;
  string local_1aa0;
  VarSpec local_1a80;
  Matrix<float,_4,_4> local_19d4;
  Matrix<float,_4,_4> local_1994;
  allocator<char> local_1951;
  string local_1950;
  VarSpec local_1930;
  int local_1888;
  allocator<char> local_1881;
  string local_1880;
  VarSpec local_1860;
  float local_17b8;
  float local_17b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1790;
  VarSpec local_1770;
  float local_16c8;
  float local_16c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a0;
  VarSpec local_1680;
  float local_15d8;
  float local_15d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b0;
  VarSpec local_1590;
  float local_14e8;
  float local_14e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0;
  VarSpec local_14a0;
  float local_13f8;
  float local_13f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d0;
  VarSpec local_13b0;
  Vector<float,_3> local_1308;
  Vector<float,_3> local_12fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d0;
  VarSpec local_12b0;
  Vector<float,_4> local_1208;
  Vector<float,_4> local_11f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  VarSpec local_11a8;
  Vector<float,_3> local_1100;
  Vector<float,_3> local_10f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  VarSpec local_10a8;
  undefined1 local_1000 [8];
  string ndxStr;
  int local_fd8;
  int i;
  string local_fd0;
  VarSpec local_fb0;
  float local_f04;
  float local_f00;
  allocator<char> local_ef9;
  string local_ef8;
  VarSpec local_ed8;
  float local_e2c;
  float local_e28;
  allocator<char> local_e21;
  string local_e20;
  VarSpec local_e00;
  float local_d54;
  float local_d50;
  allocator<char> local_d49;
  string local_d48;
  VarSpec local_d28;
  float local_c7c;
  float local_c78;
  allocator<char> local_c71;
  string local_c70;
  VarSpec local_c50;
  float local_ba4;
  float local_ba0;
  allocator<char> local_b99;
  string local_b98;
  VarSpec local_b78;
  Vector<float,_3> local_acc;
  Vector<float,_3> local_ac0;
  allocator<char> local_ab1;
  string local_ab0;
  VarSpec local_a90;
  Vector<float,_4> local_9e4;
  Vector<float,_4> local_9d4;
  allocator<char> local_9c1;
  string local_9c0;
  VarSpec local_9a0;
  Vector<float,_3> local_8f4;
  Vector<float,_3> local_8e8;
  allocator<char> local_8d9;
  string local_8d8;
  VarSpec local_8b8;
  float local_80c;
  float local_808;
  allocator<char> local_801;
  string local_800;
  VarSpec local_7e0;
  Vector<float,_3> local_734;
  Vector<float,_3> local_728;
  allocator<char> local_719;
  string local_718;
  VarSpec local_6f8;
  Vector<float,_3> local_64c;
  Vector<float,_3> local_640;
  allocator<char> local_631;
  string local_630;
  VarSpec local_610;
  Vector<float,_4> local_564;
  Vector<float,_4> local_554;
  allocator<char> local_541;
  string local_540;
  VarSpec local_520;
  Vector<float,_3> local_474;
  Vector<float,_3> local_468;
  allocator<char> local_459;
  string local_458;
  VarSpec local_438;
  Vector<float,_4> local_38c;
  Vector<float,_4> local_37c;
  allocator<char> local_369;
  string local_368;
  VarSpec local_348;
  Vector<float,_3> local_29c;
  Vector<float,_3> local_290;
  allocator<char> local_281;
  string local_280;
  VarSpec local_260;
  Vector<float,_4> local_1b4;
  Vector<float,_4> local_1a4;
  allocator<char> local_191;
  string local_190;
  VarSpec local_170;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int texHei_local;
  int texWid_local;
  ProgramLibrary *this_local;
  ProgramContext *context;
  
  local_21 = 0;
  local_20 = texHei;
  local_1c = texWid;
  _texHei_local = this;
  this_local = (ProgramLibrary *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "${VTX_HEADER}struct Material {\n\tmediump vec3 ambientColor;\n\tmediump vec4 diffuseColor;\n\tmediump vec3 emissiveColor;\n\tmediump vec3 specularColor;\n\tmediump float shininess;\n};\nstruct Light {\n\tmediump vec3 color;\n\tmediump vec4 position;\n\tmediump vec3 direction;\n\tmediump float constantAttenuation;\n\tmediump float linearAttenuation;\n\tmediump float quadraticAttenuation;\n\tmediump float spotExponent;\n\tmediump float spotCutoff;\n};\n${VTX_IN} highp vec4 a_position${NS};\n${VTX_IN} mediump vec3 a_normal${NS};\n${VTX_IN} mediump vec4 a_texCoord0${NS};\nuniform Material u_material${NS};\nuniform Light u_directionalLight${NS}[1];\nuniform mediump int u_directionalLightCount${NS};\nuniform Light u_spotLight${NS}[4];\nuniform mediump int u_spotLightCount${NS};\nuniform highp mat4 u_mvpMatrix${NS};\nuniform highp mat4 u_modelViewMatrix${NS};\nuniform mediump mat3 u_normalMatrix${NS};\nuniform mediump mat4 u_texCoordMatrix0${NS};\n${VTX_OUT} mediump vec4 v_color${NS};\n${VTX_OUT} mediump vec2 v_texCoord0${NS};\nmediump vec3 direction (mediump vec4 from, mediump vec4 to)\n{\n\treturn vec3(to.xyz * from.w - from.xyz * to.w);\n}\n\nmediump vec3 computeLighting (\n\tmediump vec3 directionToLight,\n\tmediump vec3 halfVector,\n\tmediump vec3 normal,\n\tmediump vec3 lightColor,\n\tmediump vec3 diffuseColor,\n\tmediump vec3 specularColor,\n\tmediump float shininess)\n{\n\tmediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n\tmediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n\n\tif (normalDotDirection != 0.0)\n\t\tcolor += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n\n\treturn color;\n}\n\nmediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n{\n\treturn 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n}\n\nmediump float computeSpotAttenuation (\n\tmediump vec3  directionToLight,\n\tmediump vec3  lightDir,\n\tmediump float spotExponent,\n\tmediump float spotCutoff)\n{\n\tmediump flo..." /* TRUNCATED STRING LITERAL */
             ,&local_69);
  substitute(&local_48,this,&local_68);
  vtxShaderSource_ = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "${FRAG_HEADER}uniform sampler2D u_sampler0${NS};\n${FRAG_IN} mediump vec4 v_color${NS};\n${FRAG_IN} mediump vec2 v_texCoord0${NS};\nvoid main (void)\n{\n\tmediump vec2 texCoord0 = v_texCoord0${NS};\n\tmediump vec4 color = v_color${NS};\n\tcolor *= ${TEXTURE_2D_FUNC}(u_sampler0${NS}, texCoord0);\n\t${FRAG_COLOR} = color;\n}\n"
             ,&local_c1);
  substitute(&local_a0,this,&local_c0);
  fragShaderSource_ = (char *)std::__cxx11::string::c_str();
  ProgramContext::ProgramContext
            (__return_storage_ptr__,vtxShaderSource_,fragShaderSource_,"a_position${NS}");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"a_position${NS}",&local_191);
  tcu::Vector<float,_4>::Vector(&local_1a4,-1.0);
  tcu::Vector<float,_4>::Vector(&local_1b4,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>(&local_170,&local_190,&local_1a4,&local_1b4);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->attributes,&local_170);
  VarSpec::~VarSpec(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"a_normal${NS}",&local_281);
  tcu::Vector<float,_3>::Vector(&local_290,-1.0);
  tcu::Vector<float,_3>::Vector(&local_29c,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>(&local_260,&local_280,&local_290,&local_29c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->attributes,&local_260);
  VarSpec::~VarSpec(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"a_texCoord0${NS}",&local_369);
  tcu::Vector<float,_4>::Vector(&local_37c,-1.0);
  tcu::Vector<float,_4>::Vector(&local_38c,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>(&local_348,&local_368,&local_37c,&local_38c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->attributes,&local_348);
  VarSpec::~VarSpec(&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"u_material${NS}.ambientColor",&local_459);
  tcu::Vector<float,_3>::Vector(&local_468,0.0);
  tcu::Vector<float,_3>::Vector(&local_474,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>(&local_438,&local_458,&local_468,&local_474);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_438);
  VarSpec::~VarSpec(&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"u_material${NS}.diffuseColor",&local_541);
  tcu::Vector<float,_4>::Vector(&local_554,0.0);
  tcu::Vector<float,_4>::Vector(&local_564,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>(&local_520,&local_540,&local_554,&local_564);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_520);
  VarSpec::~VarSpec(&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"u_material${NS}.emissiveColor",&local_631);
  tcu::Vector<float,_3>::Vector(&local_640,0.0);
  tcu::Vector<float,_3>::Vector(&local_64c,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>(&local_610,&local_630,&local_640,&local_64c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_610);
  VarSpec::~VarSpec(&local_610);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"u_material${NS}.specularColor",&local_719);
  tcu::Vector<float,_3>::Vector(&local_728,0.0);
  tcu::Vector<float,_3>::Vector(&local_734,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>(&local_6f8,&local_718,&local_728,&local_734);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_6f8);
  VarSpec::~VarSpec(&local_6f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,"u_material${NS}.shininess",&local_801);
  local_808 = 0.0;
  local_80c = 1.0;
  VarSpec::VarSpec<float>(&local_7e0,&local_800,&local_808,&local_80c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_7e0);
  VarSpec::~VarSpec(&local_7e0);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"u_directionalLight${NS}[0].color",&local_8d9);
  tcu::Vector<float,_3>::Vector(&local_8e8,0.0);
  tcu::Vector<float,_3>::Vector(&local_8f4,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>(&local_8b8,&local_8d8,&local_8e8,&local_8f4);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_8b8);
  VarSpec::~VarSpec(&local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"u_directionalLight${NS}[0].position",&local_9c1);
  tcu::Vector<float,_4>::Vector(&local_9d4,-1.0);
  tcu::Vector<float,_4>::Vector(&local_9e4,1.0);
  VarSpec::VarSpec<tcu::Vector<float,4>>(&local_9a0,&local_9c0,&local_9d4,&local_9e4);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_9a0);
  VarSpec::~VarSpec(&local_9a0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator(&local_9c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab0,"u_directionalLight${NS}[0].direction",&local_ab1);
  tcu::Vector<float,_3>::Vector(&local_ac0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_acc,1.0);
  VarSpec::VarSpec<tcu::Vector<float,3>>(&local_a90,&local_ab0,&local_ac0,&local_acc);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_a90);
  VarSpec::~VarSpec(&local_a90);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b98,"u_directionalLight${NS}[0].constantAttenuation",&local_b99);
  local_ba0 = 0.1;
  local_ba4 = 1.0;
  VarSpec::VarSpec<float>(&local_b78,&local_b98,&local_ba0,&local_ba4);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_b78);
  VarSpec::~VarSpec(&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::allocator<char>::~allocator(&local_b99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c70,"u_directionalLight${NS}[0].linearAttenuation",&local_c71);
  local_c78 = 0.1;
  local_c7c = 1.0;
  VarSpec::VarSpec<float>(&local_c50,&local_c70,&local_c78,&local_c7c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_c50);
  VarSpec::~VarSpec(&local_c50);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator(&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d48,"u_directionalLight${NS}[0].quadraticAttenuation",&local_d49);
  local_d50 = 0.1;
  local_d54 = 1.0;
  VarSpec::VarSpec<float>(&local_d28,&local_d48,&local_d50,&local_d54);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_d28);
  VarSpec::~VarSpec(&local_d28);
  std::__cxx11::string::~string((string *)&local_d48);
  std::allocator<char>::~allocator(&local_d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e20,"u_directionalLight${NS}[0].spotExponent",&local_e21);
  local_e28 = 0.1;
  local_e2c = 1.0;
  VarSpec::VarSpec<float>(&local_e00,&local_e20,&local_e28,&local_e2c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_e00);
  VarSpec::~VarSpec(&local_e00);
  std::__cxx11::string::~string((string *)&local_e20);
  std::allocator<char>::~allocator(&local_e21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ef8,"u_directionalLight${NS}[0].spotCutoff",&local_ef9);
  local_f00 = 0.1;
  local_f04 = 1.0;
  VarSpec::VarSpec<float>(&local_ed8,&local_ef8,&local_f00,&local_f04);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_ed8);
  VarSpec::~VarSpec(&local_ed8);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::allocator<char>::~allocator(&local_ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fd0,"u_directionalLightCount${NS}",(allocator<char> *)((long)&i + 3));
  local_fd8 = 1;
  VarSpec::VarSpec<int>(&local_fb0,&local_fd0,&stack0xfffffffffffff028);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_fb0);
  VarSpec::~VarSpec(&local_fb0);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  for (ndxStr.field_2._12_4_ = 0; (int)ndxStr.field_2._12_4_ < 4;
      ndxStr.field_2._12_4_ = ndxStr.field_2._12_4_ + 1) {
    de::toString<int>((string *)local_1000,(int *)(ndxStr.field_2._M_local_buf + 0xc));
    std::operator+(&local_10e8,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_10c8,&local_10e8,"].color");
    tcu::Vector<float,_3>::Vector(&local_10f4,0.0);
    tcu::Vector<float,_3>::Vector(&local_1100,1.0);
    VarSpec::VarSpec<tcu::Vector<float,3>>(&local_10a8,&local_10c8,&local_10f4,&local_1100);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_10a8);
    VarSpec::~VarSpec(&local_10a8);
    std::__cxx11::string::~string((string *)&local_10c8);
    std::__cxx11::string::~string((string *)&local_10e8);
    std::operator+(&local_11e8,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_11c8,&local_11e8,"].position");
    tcu::Vector<float,_4>::Vector(&local_11f8,-1.0);
    tcu::Vector<float,_4>::Vector(&local_1208,1.0);
    VarSpec::VarSpec<tcu::Vector<float,4>>(&local_11a8,&local_11c8,&local_11f8,&local_1208);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_11a8);
    VarSpec::~VarSpec(&local_11a8);
    std::__cxx11::string::~string((string *)&local_11c8);
    std::__cxx11::string::~string((string *)&local_11e8);
    std::operator+(&local_12f0,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_12d0,&local_12f0,"].direction");
    tcu::Vector<float,_3>::Vector(&local_12fc,-1.0);
    tcu::Vector<float,_3>::Vector(&local_1308,1.0);
    VarSpec::VarSpec<tcu::Vector<float,3>>(&local_12b0,&local_12d0,&local_12fc,&local_1308);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_12b0);
    VarSpec::~VarSpec(&local_12b0);
    std::__cxx11::string::~string((string *)&local_12d0);
    std::__cxx11::string::~string((string *)&local_12f0);
    std::operator+(&local_13f0,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_13d0,&local_13f0,"].constantAttenuation");
    local_13f4 = 0.1;
    local_13f8 = 1.0;
    VarSpec::VarSpec<float>(&local_13b0,&local_13d0,&local_13f4,&local_13f8);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_13b0);
    VarSpec::~VarSpec(&local_13b0);
    std::__cxx11::string::~string((string *)&local_13d0);
    std::__cxx11::string::~string((string *)&local_13f0);
    std::operator+(&local_14e0,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_14c0,&local_14e0,"].linearAttenuation");
    local_14e4 = 0.1;
    local_14e8 = 1.0;
    VarSpec::VarSpec<float>(&local_14a0,&local_14c0,&local_14e4,&local_14e8);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_14a0);
    VarSpec::~VarSpec(&local_14a0);
    std::__cxx11::string::~string((string *)&local_14c0);
    std::__cxx11::string::~string((string *)&local_14e0);
    std::operator+(&local_15d0,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_15b0,&local_15d0,"].quadraticAttenuation");
    local_15d4 = 0.1;
    local_15d8 = 1.0;
    VarSpec::VarSpec<float>(&local_1590,&local_15b0,&local_15d4,&local_15d8);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_1590);
    VarSpec::~VarSpec(&local_1590);
    std::__cxx11::string::~string((string *)&local_15b0);
    std::__cxx11::string::~string((string *)&local_15d0);
    std::operator+(&local_16c0,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_16a0,&local_16c0,"].spotExponent");
    local_16c4 = 0.1;
    local_16c8 = 1.0;
    VarSpec::VarSpec<float>(&local_1680,&local_16a0,&local_16c4,&local_16c8);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_1680);
    VarSpec::~VarSpec(&local_1680);
    std::__cxx11::string::~string((string *)&local_16a0);
    std::__cxx11::string::~string((string *)&local_16c0);
    std::operator+(&local_17b0,"u_spotLight${NS}[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000);
    std::operator+(&local_1790,&local_17b0,"].spotCutoff");
    local_17b4 = 0.1;
    local_17b8 = 1.0;
    VarSpec::VarSpec<float>(&local_1770,&local_1790,&local_17b4,&local_17b8);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
              (&__return_storage_ptr__->uniforms,&local_1770);
    VarSpec::~VarSpec(&local_1770);
    std::__cxx11::string::~string((string *)&local_1790);
    std::__cxx11::string::~string((string *)&local_17b0);
    std::__cxx11::string::~string((string *)local_1000);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1880,"u_spotLightCount${NS}",&local_1881);
  local_1888 = 4;
  VarSpec::VarSpec<int>(&local_1860,&local_1880,&local_1888);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_1860);
  VarSpec::~VarSpec(&local_1860);
  std::__cxx11::string::~string((string *)&local_1880);
  std::allocator<char>::~allocator(&local_1881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1950,"u_mvpMatrix${NS}",&local_1951);
  translationMat<4>(&local_1994,-0.2);
  translationMat<4>(&local_19d4,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>(&local_1930,&local_1950,&local_1994,&local_19d4);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_1930);
  VarSpec::~VarSpec(&local_1930);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_19d4);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_1994);
  std::__cxx11::string::~string((string *)&local_1950);
  std::allocator<char>::~allocator(&local_1951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1aa0,"u_modelViewMatrix${NS}",&local_1aa1);
  translationMat<4>(&local_1ae4,-0.2);
  translationMat<4>(&local_1b24,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>(&local_1a80,&local_1aa0,&local_1ae4,&local_1b24);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_1a80);
  VarSpec::~VarSpec(&local_1a80);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_1b24);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_1ae4);
  std::__cxx11::string::~string((string *)&local_1aa0);
  std::allocator<char>::~allocator(&local_1aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1bf0,"u_normalMatrix${NS}",&local_1bf1);
  translationMat<3>(&local_1c18,-0.2);
  translationMat<3>(&local_1c3c,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,3,3>>(&local_1bd0,&local_1bf0,&local_1c18,&local_1c3c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_1bd0);
  VarSpec::~VarSpec(&local_1bd0);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_1c3c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_1c18);
  std::__cxx11::string::~string((string *)&local_1bf0);
  std::allocator<char>::~allocator(&local_1bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d08,"u_texCoordMatrix0${NS}",&local_1d09);
  translationMat<4>(&local_1d4c,-0.2);
  translationMat<4>(&local_1d8c,0.2);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>(&local_1ce8,&local_1d08,&local_1d4c,&local_1d8c);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_1ce8);
  VarSpec::~VarSpec(&local_1ce8);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_1d8c);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_1d4c);
  std::__cxx11::string::~string((string *)&local_1d08);
  std::allocator<char>::~allocator(&local_1d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e58,"u_sampler0${NS}",&local_1e59);
  local_1e60 = 0;
  VarSpec::VarSpec<int>(&local_1e38,&local_1e58,&local_1e60);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::push_back
            (&__return_storage_ptr__->uniforms,&local_1e38);
  VarSpec::~VarSpec(&local_1e38);
  std::__cxx11::string::~string((string *)&local_1e58);
  std::allocator<char>::~allocator(&local_1e59);
  width_ = local_1c;
  height_ = local_20;
  tcu::Vector<float,_4>::Vector(&local_1ec0,0.0);
  tcu::Vector<float,_4>::Vector(&local_1ed0,1.0);
  TextureSpec::TextureSpec
            (&local_1eb0,TEXTURETYPE_2D,0,width_,height_,0x1908,0x1401,0x1908,true,0x2601,0x2601,
             0x2901,0x2901,&local_1ec0,&local_1ed0);
  std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::push_back
            (&__return_storage_ptr__->textureSpecs,&local_1eb0);
  return __return_storage_ptr__;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateVertexUniformLoopLightContext (const int texWid, const int texHei) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"struct Material {\n"
		"	mediump vec3 ambientColor;\n"
		"	mediump vec4 diffuseColor;\n"
		"	mediump vec3 emissiveColor;\n"
		"	mediump vec3 specularColor;\n"
		"	mediump float shininess;\n"
		"};\n"
		"struct Light {\n"
		"	mediump vec3 color;\n"
		"	mediump vec4 position;\n"
		"	mediump vec3 direction;\n"
		"	mediump float constantAttenuation;\n"
		"	mediump float linearAttenuation;\n"
		"	mediump float quadraticAttenuation;\n"
		"	mediump float spotExponent;\n"
		"	mediump float spotCutoff;\n"
		"};\n"
		"${VTX_IN} highp vec4 a_position${NS};\n"
		"${VTX_IN} mediump vec3 a_normal${NS};\n"
		"${VTX_IN} mediump vec4 a_texCoord0${NS};\n"
		"uniform Material u_material${NS};\n"
		"uniform Light u_directionalLight${NS}[1];\n"
		"uniform mediump int u_directionalLightCount${NS};\n"
		"uniform Light u_spotLight${NS}[4];\n"
		"uniform mediump int u_spotLightCount${NS};\n"
		"uniform highp mat4 u_mvpMatrix${NS};\n"
		"uniform highp mat4 u_modelViewMatrix${NS};\n"
		"uniform mediump mat3 u_normalMatrix${NS};\n"
		"uniform mediump mat4 u_texCoordMatrix0${NS};\n"
		"${VTX_OUT} mediump vec4 v_color${NS};\n"
		"${VTX_OUT} mediump vec2 v_texCoord0${NS};\n"
		"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
		"{\n"
		"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
		"}\n"
		"\n"
		"mediump vec3 computeLighting (\n"
		"	mediump vec3 directionToLight,\n"
		"	mediump vec3 halfVector,\n"
		"	mediump vec3 normal,\n"
		"	mediump vec3 lightColor,\n"
		"	mediump vec3 diffuseColor,\n"
		"	mediump vec3 specularColor,\n"
		"	mediump float shininess)\n"
		"{\n"
		"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
		"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
		"\n"
		"	if (normalDotDirection != 0.0)\n"
		"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
		"\n"
		"	return color;\n"
		"}\n"
		"\n"
		"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
		"{\n"
		"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
		"}\n"
		"\n"
		"mediump float computeSpotAttenuation (\n"
		"	mediump vec3  directionToLight,\n"
		"	mediump vec3  lightDir,\n"
		"	mediump float spotExponent,\n"
		"	mediump float spotCutoff)\n"
		"{\n"
		"	mediump float spotEffect = dot(lightDir, normalize(-directionToLight));\n"
		"\n"
		"	if (spotEffect < spotCutoff)\n"
		"		spotEffect = 0.0;\n"
		"\n"
		"	spotEffect = pow(spotEffect, spotExponent);\n"
		"	return spotEffect;\n"
		"}\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	highp vec4 position = a_position${NS};\n"
		"	highp vec3 normal = a_normal${NS};\n"
		"	gl_Position = u_mvpMatrix${NS} * position;\n"
		"	v_texCoord0${NS} = (u_texCoordMatrix0${NS} * a_texCoord0${NS}).xy;\n"
		"	mediump vec4 color = vec4(u_material${NS}.emissiveColor, u_material${NS}.diffuseColor.a);\n"
		"\n"
		"	highp vec4 eyePosition = u_modelViewMatrix${NS} * position;\n"
		"	mediump vec3 eyeNormal = normalize(u_normalMatrix${NS} * normal);\n"
		"	for (int i = 0; i < u_directionalLightCount${NS}; i++)\n"
		"	{\n"
		"		mediump vec3 directionToLight = -u_directionalLight${NS}[i].direction;\n"
		"		mediump vec3 halfVector = normalize(directionToLight + vec3(0.0, 0.0, 1.0));\n"
		"		color.rgb += computeLighting(directionToLight, halfVector, eyeNormal, u_directionalLight${NS}[i].color, u_material${NS}.diffuseColor.rgb, u_material${NS}.specularColor, u_material${NS}.shininess);\n"
		"	}\n"
		"\n"
		"	for (int i = 0; i < u_spotLightCount${NS}; i++)\n"
		"	{\n"
		"		mediump float distanceToLight = distance(eyePosition, u_spotLight${NS}[i].position);\n"
		"		mediump vec3 directionToLight = normalize(direction(eyePosition, u_spotLight${NS}[i].position));\n"
		"		mediump vec3 halfVector = normalize(directionToLight + vec3(0.0, 0.0, 1.0));\n"
		"		color.rgb += computeLighting(directionToLight, halfVector, eyeNormal, u_spotLight${NS}[i].color, u_material${NS}.diffuseColor.rgb, u_material${NS}.specularColor, u_material${NS}.shininess) * computeDistanceAttenuation(distanceToLight, u_spotLight${NS}[i].constantAttenuation, u_spotLight${NS}[i].linearAttenuation, u_spotLight${NS}[i].quadraticAttenuation) * computeSpotAttenuation(directionToLight, u_spotLight${NS}[i].direction, u_spotLight${NS}[i].spotExponent, u_spotLight${NS}[i].spotCutoff);\n"
		"	}\n"
		"\n"
		"\n"
		"	v_color${NS} = color;\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"uniform sampler2D u_sampler0${NS};\n"
		"${FRAG_IN} mediump vec4 v_color${NS};\n"
		"${FRAG_IN} mediump vec2 v_texCoord0${NS};\n"
		"void main (void)\n"
		"{\n"
		"	mediump vec2 texCoord0 = v_texCoord0${NS};\n"
		"	mediump vec4 color = v_color${NS};\n"
		"	color *= ${TEXTURE_2D_FUNC}(u_sampler0${NS}, texCoord0);\n"
		"	${FRAG_COLOR} = color;\n"
		"}\n";

	gls::ProgramContext context(substitute(vertexTemplate).c_str(), substitute(fragmentTemplate).c_str(), "a_position${NS}");

	context.attributes.push_back	(gls::VarSpec("a_position${NS}",									Vec4(-1.0f),				Vec4(1.0f)));
	context.attributes.push_back	(gls::VarSpec("a_normal${NS}",										Vec3(-1.0f),				Vec3(1.0f)));
	context.attributes.push_back	(gls::VarSpec("a_texCoord0${NS}",									Vec4(-1.0f),				Vec4(1.0f)));

	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.ambientColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.diffuseColor",						Vec4(0.0f),					Vec4(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.emissiveColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.specularColor",						Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_material${NS}.shininess",							0.0f,						1.0f));

	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].color",					Vec3(0.0f),					Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].position",				Vec4(-1.0f),				Vec4(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].direction",				Vec3(-1.0f),				Vec3(1.0f)));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].constantAttenuation",		0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].linearAttenuation",		0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].quadraticAttenuation",	0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].spotExponent",			0.1f,						1.0f));
	context.uniforms.push_back		(gls::VarSpec("u_directionalLight${NS}[0].spotCutoff",				0.1f,						1.0f));

	context.uniforms.push_back		(gls::VarSpec("u_directionalLightCount${NS}",						1));

	for (int i = 0; i < 4; i++)
	{
		const std::string ndxStr = de::toString(i);

		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].color",					Vec3(0.0f),					Vec3(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].position",				Vec4(-1.0f),				Vec4(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].direction",				Vec3(-1.0f),				Vec3(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].constantAttenuation",		0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].linearAttenuation",		0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].quadraticAttenuation",	0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].spotExponent",			0.1f,						1.0f));
		context.uniforms.push_back(gls::VarSpec("u_spotLight${NS}["+ndxStr+"].spotCutoff",				0.1f,						1.0f));
	}

	context.uniforms.push_back		(gls::VarSpec("u_spotLightCount${NS}",								4));

	context.uniforms.push_back		(gls::VarSpec("u_mvpMatrix${NS}",									translationMat<4>(-0.2f),	translationMat<4>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_modelViewMatrix${NS}",								translationMat<4>(-0.2f),	translationMat<4>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_normalMatrix${NS}",								translationMat<3>(-0.2f),	translationMat<3>(0.2f)));
	context.uniforms.push_back		(gls::VarSpec("u_texCoordMatrix0${NS}",								translationMat<4>(-0.2f),	translationMat<4>(0.2f)));

	context.uniforms.push_back		(gls::VarSpec("u_sampler0${NS}",									0));

	context.textureSpecs.push_back	(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, 0,
													  texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA,
													  true, GL_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
													  Vec4(0.0f), Vec4(1.0f)));

	return context;
}